

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

int __thiscall
axl::sl::StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::copy
          (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  SrcUnit *src_00;
  C *pCVar1;
  bool in_stack_0000001f;
  size_t newLength;
  StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *in_stack_00000028;
  undefined1 in_stack_ffffffffffffffc8 [16];
  undefined1 auVar2 [12];
  undefined4 local_8;
  
  if (src == (EVP_PKEY_CTX *)0xffffffffffffffff) {
    src = (EVP_PKEY_CTX *)StringDetailsBase<char>::calcLength((C *)this);
  }
  if (src == (EVP_PKEY_CTX *)0x0) {
    clear(this);
    local_8 = 0;
  }
  else {
    src_00 = (SrcUnit *)
             enc::
             Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::sl::Nop<wchar_t,_wchar_t>,_axl::enc::Utf8Decoder>
             ::calcRequiredLength
                       (in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._0_8_,
                        (utf32_t)((ulong)this >> 0x20));
    auVar2 = in_stack_ffffffffffffffc8._4_12_;
    pCVar1 = createBuffer(in_stack_00000028,newLength,in_stack_0000001f);
    if (pCVar1 == (C *)0x0) {
      local_8 = -1;
    }
    else {
      enc::
      Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::sl::Nop<wchar_t,_wchar_t>,_axl::enc::Utf8Decoder>
      ::convert_u((DstUnit *)src,src_00,auVar2._4_8_,auVar2._0_4_);
      local_8 = (int)src_00;
    }
  }
  return local_8;
}

Assistant:

size_t
	copy(
		const C2* p,
		size_t length = -1
	) {
		if (length == -1)
			length = Details2::calcLength(p);

		if (!length) {
			clear();
			return 0;
		}

		// TODO: remove pre-calculation of required length

		size_t newLength = enc::Convert<Encoding, Encoding2>::calcRequiredLength(p, p + length);
		if (!createBuffer(newLength, false))
			return -1;

		enc::Convert<Encoding, Encoding2>::convert_u(this->m_p, p, p + length);
		return newLength;
	}